

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::fullPrice(HEkk *this,HVector *full_col,HVector *full_row)

{
  HVectorBase<double> *in_RSI;
  HighsSimplexAnalysis *in_RDI;
  bool quad_precision;
  double expected_density;
  HVector *in_stack_00000038;
  HVector *in_stack_00000040;
  bool in_stack_0000004f;
  HighsSparseMatrix *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffc8;
  HighsInt in_stack_ffffffffffffffcc;
  HighsInt in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint simplex_clock;
  HighsSimplexAnalysis *in_stack_ffffffffffffffe0;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  HVectorBase<double>::clear(in_RSI);
  if ((in_RDI->devex_iteration_count & 0x100) != 0) {
    in_stack_ffffffffffffffe0 = (HighsSimplexAnalysis *)0x3ff0000000000000;
    HighsSimplexAnalysis::operationRecordBefore
              ((HighsSimplexAnalysis *)0x3ff0000000000000,in_stack_ffffffffffffffdc,
               (HVector *)in_RDI,
               (double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  simplex_clock = in_stack_ffffffffffffffdc & 0xffffff;
  HighsSparseMatrix::priceByColumn
            (in_stack_00000050,in_stack_0000004f,in_stack_00000040,in_stack_00000038,this._4_4_);
  if ((in_RDI->devex_iteration_count & 0x100) != 0) {
    HighsSimplexAnalysis::operationRecordAfter(in_RDI,in_stack_ffffffffffffffcc,(HVector *)0x772ed8)
    ;
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_ffffffffffffffe0,simplex_clock,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void HEkk::fullPrice(const HVector& full_col, HVector& full_row) {
  analysis_.simplexTimerStart(PriceFullClock);
  full_row.clear();
  if (analysis_.analyse_simplex_summary_data) {
    const double expected_density = 1;
    analysis_.operationRecordBefore(kSimplexNlaPriceFull, full_col,
                                    expected_density);
  }
  const bool quad_precision = false;
  lp_.a_matrix_.priceByColumn(quad_precision, full_row, full_col);
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordAfter(kSimplexNlaPriceFull, full_row);
  analysis_.simplexTimerStop(PriceFullClock);
}